

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall soplex::SPxLPBase<double>::clear(SPxLPBase<double> *this)

{
  LPRowSetBase<double>::clear(&this->super_LPRowSetBase<double>);
  LPColSetBase<double>::clear(&this->super_LPColSetBase<double>);
  this->thesense = MAXIMIZE;
  this->offset = 0.0;
  this->_isScaled = false;
  this->lp_scaler = (SPxScaler<double> *)0x0;
  (this->super_LPColSetBase<double>).scaleExp.thesize = 0;
  (this->super_LPRowSetBase<double>).scaleExp.thesize = 0;
  return;
}

Assistant:

virtual void clear()
   {

      LPRowSetBase<R>::clear();
      LPColSetBase<R>::clear();
      thesense = MAXIMIZE;
      offset = 0;
      _isScaled = false;
      lp_scaler = nullptr;
      LPColSetBase<R>::scaleExp.clear();
      LPRowSetBase<R>::scaleExp.clear();
   }